

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O1

Smf * rlib::midi::Smf::fromStream(Smf *__return_storage_ptr__,istream *is)

{
  undefined1 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  byte bVar10;
  uchar uVar11;
  byte bVar12;
  array<unsigned_char,_2UL> aVar13;
  void *__tmp;
  long lVar14;
  TrackChunk TVar15;
  long lVar16;
  uint64_t uVar17;
  runtime_error *prVar18;
  undefined8 uVar19;
  undefined1 *puVar20;
  uint uVar21;
  char *pcVar22;
  byte bVar23;
  ulong unaff_R14;
  undefined1 auVar24 [16];
  HeaderChunk HVar25;
  TrackChunk c;
  uint64_t currentPosition;
  uint8_t n;
  exception_ptr ep;
  anon_class_8_1_3fcf65e8 readVariableValue;
  Track track;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  unsigned_long local_c8;
  shared_ptr<rlib::midi::EventExclusive> local_c0;
  long local_b0;
  Smf *local_a0;
  list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *local_98;
  anon_class_8_1_3fcf65e8 local_90;
  undefined8 local_88;
  undefined4 local_80;
  ushort uStack_7c;
  undefined2 uStack_7a;
  undefined8 local_78;
  undefined4 *local_70;
  undefined4 *local_68;
  undefined8 local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  
  __return_storage_ptr__->timeBase = 0x1e0;
  local_98 = &__return_storage_ptr__->tracks;
  (__return_storage_ptr__->tracks).
  super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)local_98;
  (__return_storage_ptr__->tracks).
  super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)local_98;
  (__return_storage_ptr__->tracks).
  super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>._M_impl._M_node.
  _M_size = 0;
  local_a0 = __return_storage_ptr__;
  HVar25 = Inner::read<rlib::midi::Smf::Inner::HeaderChunk>(is);
  local_88 = HVar25._0_8_;
  local_80 = HVar25._8_4_;
  uStack_7c = HVar25.division;
  if (HVar25.MThd._M_elems._M_elems != (_Type)0x6468544d) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar18,"MThd chunk error");
    __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar14 = 4;
  puVar20 = (undefined1 *)((long)&local_88 + 7);
  do {
    uVar1 = *(undefined1 *)((long)&local_88 + lVar14);
    *(undefined1 *)((long)&local_88 + lVar14) = *puVar20;
    *puVar20 = uVar1;
    puVar20 = puVar20 + -1;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 6);
  auVar24._6_2_ = uStack_7a;
  auVar24._0_6_ = HVar25._8_6_;
  auVar24._8_8_ = 0;
  auVar24 = psllw(auVar24,8);
  uStack_7c = uStack_7c << 8 | uStack_7c >> 8;
  local_a0->timeBase = (uint)uStack_7c;
  local_b0 = 0;
  uVar21 = (auVar24._0_4_ | (uint)(ushort)(HVar25.trackCount >> 8) << 0x10) >> 0x10;
  local_50 = (ulong)uVar21;
  if (uVar21 != 0) {
    unaff_R14 = 0;
    do {
      TVar15 = Inner::read<rlib::midi::Smf::Inner::TrackChunk>(is);
      local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)TVar15;
      if (TVar15.MTrk._M_elems._M_elems != (_Type)0x6b72544d) {
        prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar18,"MTrk chunk error.");
        __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar14 = 4;
      puVar20 = (undefined1 *)((long)&local_e8 + 7);
      do {
        uVar1 = *(undefined1 *)((long)&local_e8 + lVar14);
        *(undefined1 *)((long)&local_e8 + lVar14) = *puVar20;
        *puVar20 = uVar1;
        puVar20 = puVar20 + -1;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 6);
      local_80 = 0;
      local_78 = 0;
      local_70 = &local_80;
      local_60 = 0;
      local_c8 = 0;
      local_68 = local_70;
      local_48 = unaff_R14;
      lVar14 = std::istream::tellg();
      bVar23 = 0;
LAB_00153f09:
      while (lVar16 = std::istream::tellg(), lVar16 - lVar14 < (long)((ulong)TVar15 >> 0x20)) {
        local_90.is = is;
        uVar17 = fromStream::anon_class_8_1_3fcf65e8::operator()(&local_90);
        local_c8 = local_c8 + uVar17;
        bVar10 = Inner::read<unsigned_char_const>(is);
        if (-1 < (char)bVar10) {
          std::istream::seekg((long)is,~_S_beg);
          bVar10 = bVar23;
        }
        bVar23 = bVar10;
        switch(bVar10 - 0x80 >> 4) {
        case 0:
          aVar13 = Inner::read<std::array<unsigned_char,2ul>const>(is);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._0_16_ = auVar2 << 0x40;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_0017b860;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar10 & 0xf;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 9) =
               aVar13._M_elems[0] & 0x7f;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 10) =
               aVar13._M_elems[1] & 0x7f;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_0017b8b0;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_e8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventNoteOff>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_c8,(shared_ptr<rlib::midi::EventNoteOff> *)&local_e8);
          break;
        case 1:
          aVar13 = Inner::read<std::array<unsigned_char,2ul>const>(is);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._0_16_ = auVar6 << 0x40;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_0017b928;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar10 & 0xf;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 9) =
               aVar13._M_elems[0] & 0x7f;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 10) =
               aVar13._M_elems[1] & 0x7f;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_0017b978;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_e8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventNoteOn>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_c8,(shared_ptr<rlib::midi::EventNoteOn> *)&local_e8);
          break;
        case 2:
          aVar13 = Inner::read<std::array<unsigned_char,2ul>const>(is);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._0_16_ = auVar4 << 0x40;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_0017b9a0;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar10 & 0xf;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_0017b9f0;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 9) =
               aVar13._M_elems[0] & 0x7f;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 10) =
               aVar13._M_elems[1] & 0x7f;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_e8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventPolyphonicKeyPressure>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_c8,
                     (shared_ptr<rlib::midi::EventPolyphonicKeyPressure> *)&local_e8);
          break;
        case 3:
          aVar13 = Inner::read<std::array<unsigned_char,2ul>const>(is);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._0_16_ = auVar5 << 0x40;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x28);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_0017ba30;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar10 & 0xf;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_0017ba80;
          *(uint *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 0xc) =
               (ushort)aVar13._M_elems & 0x7f;
          *(byte *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_e8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish + 0x20))->_vptr__Sp_counted_base =
               aVar13._M_elems[1] & 0x7f;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_e8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventControlChange>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_c8,(shared_ptr<rlib::midi::EventControlChange> *)&local_e8)
          ;
          break;
        case 4:
          bVar12 = Inner::read<unsigned_char_const>(is);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._0_16_ = auVar3 << 0x40;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_0017baa8;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar10 & 0xf;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_0017baf8;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 9) = bVar12 & 0x7f;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_e8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventProgramChange>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_c8,(shared_ptr<rlib::midi::EventProgramChange> *)&local_e8)
          ;
          break;
        case 5:
          bVar12 = Inner::read<unsigned_char_const>(is);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._0_16_ = auVar7 << 0x40;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_0017bb98;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar10 & 0xf;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_0017bbe8;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 9) = bVar12 & 0x7f;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_e8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventChannelPressure>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_c8,
                     (shared_ptr<rlib::midi::EventChannelPressure> *)&local_e8);
          break;
        case 6:
          aVar13 = Inner::read<std::array<unsigned_char,2ul>const>(is);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._0_16_ = auVar8 << 0x40;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)operator_new(0x20);
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_use_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_M_weak_count = 1;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_0017bb20;
          *(byte *)((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 0x10U + 8) = bVar10 & 0xf;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          ((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish + 0x10))->_vptr__Sp_counted_base =
               (_func_int **)&PTR__Event_0017bb70;
          *(ushort *)
           ((long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish + 0x10U + 10) =
               ((ushort)aVar13._M_elems >> 1 & 0x3f80) + ((ushort)aVar13._M_elems & 0x7f) + -0x2000;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((long)local_e8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish + 0x10);
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventPitchBend>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_c8,(shared_ptr<rlib::midi::EventPitchBend> *)&local_e8);
          break;
        default:
          if (bVar10 != 0xff) goto code_r0x0015417f;
          bVar10 = Inner::read<unsigned_char_const>(is);
          uVar17 = fromStream::anon_class_8_1_3fcf65e8::operator()(&local_90);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_e8,uVar17,(allocator_type *)&local_c0);
          lVar16 = std::istream::read((char *)is,
                                      (long)local_e8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
          if ((long)*(size_type *)(lVar16 + 8) <
              (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (&local_e8,*(size_type *)(lVar16 + 8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::clog,"[warning] meta data size error.",0x1f);
            std::ios::widen((char)*(undefined8 *)(std::clog + -0x18));
            std::ostream::put('\0');
            std::ostream::flush();
          }
          local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)0x0;
          local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
          (local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count = 1;
          (local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_weak_count = 1;
          (local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base =
               (_func_int **)&PTR___Sp_counted_ptr_inplace_0017b7d8;
          local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (element_type *)
                 (local_c0.
                  super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi + 1);
          local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__EventMeta_0017b828;
          local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi[1]._M_use_count = (uint)bVar10;
          local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi[2]._vptr__Sp_counted_base =
               (_func_int **)
               local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(pointer *)
           &local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi[2]._M_use_count =
               local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi[3]._vptr__Sp_counted_base =
               (_func_int **)
               local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
          ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventMeta>>
                    ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                      *)&local_88,&local_c8,(shared_ptr<rlib::midi::EventMeta> *)&local_c0);
          goto LAB_00154592;
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
           ) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        }
      }
      std::__cxx11::list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::
      _M_insert<rlib::midi::Smf::Track>(local_98,(iterator)local_98,(Track *)&local_88);
      uVar9 = local_48;
      std::
      _Rb_tree<rlib::midi::Smf::Event,_rlib::midi::Smf::Event,_std::_Identity<rlib::midi::Smf::Event>,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
      ::~_Rb_tree((_Rb_tree<rlib::midi::Smf::Event,_rlib::midi::Smf::Event,_std::_Identity<rlib::midi::Smf::Event>,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                   *)&local_88);
      unaff_R14 = uVar9 + 1;
    } while (unaff_R14 != local_50);
  }
  if (local_b0 != 0) {
    local_58 = local_b0;
    std::__exception_ptr::exception_ptr::_M_addref();
    uVar19 = std::rethrow_exception((exception_ptr)&local_58);
    __cxa_free_exception(unaff_R14);
    std::__cxx11::_List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::
    _M_clear(&local_98->
              super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>);
    _Unwind_Resume(uVar19);
  }
  return local_a0;
code_r0x0015417f:
  if (bVar10 == 0xf0) {
    uVar17 = fromStream::anon_class_8_1_3fcf65e8::operator()(&local_90);
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
    for (; uVar17 != 0; uVar17 = uVar17 - 1) {
      uVar11 = Inner::read<unsigned_char_const>(is);
      local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT71(local_c0.
                    super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._1_7_,uVar11);
      if (uVar11 == 0xf7) {
        lVar16 = 0x3d;
        pcVar22 = "[warning] exclusive size error. EOX(0xf7) is failed position.";
        if (uVar17 != 1) {
LAB_001544d6:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,pcVar22,lVar16);
          std::ios::widen((char)*(undefined8 *)(std::clog + -0x18));
          std::ostream::put('\0');
          std::ostream::flush();
        }
        break;
      }
      if ((char)uVar11 < '\0') {
        lVar16 = 0x35;
        pcVar22 = "[warning] exclusive data error. EOX(0xf7) is missing.";
        goto LAB_001544d6;
      }
      if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(uchar *)&local_c0);
      }
      else {
        *local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar11;
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1);
      }
    }
    local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    (local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi)->_M_use_count = 1;
    (local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi)->_M_weak_count = 1;
    (local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017bc28;
    local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi + 1);
    local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__EventExclusive_0017bc78;
    *(pointer *)
     &local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._M_use_count =
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi[2]._vptr__Sp_counted_base =
         (_func_int **)
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(pointer *)
     &local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[2]._M_use_count =
         local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
    ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventExclusive>>
              ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                *)&local_88,&local_c8,&local_c0);
LAB_00154592:
    if (local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.super___shared_ptr<rlib::midi::EventExclusive,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((element_type *)
        local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (element_type *)0x0) {
      operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_e8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  goto LAB_00153f09;
}

Assistant:

Smf Smf::fromStream(std::istream& is)
{
	using namespace midi;

	Smf smf;

	const auto headerChunk = [&is]() {
		Inner::HeaderChunk c = Inner::read<decltype(c)>(is);
		if (c.MThd != Inner::HeaderChunk().MThd) {
			throw std::runtime_error("MThd chunk error");
		}
		Inner::changeEndian(c.dataLength);
		Inner::changeEndian(c.format);
		Inner::changeEndian(c.trackCount);
		Inner::changeEndian(c.division);
		return c;
	}();

	smf.timeBase = headerChunk.division;

	// トラックチャンク
	std::exception_ptr ep;	// 例外保持
	try {
		for (size_t i = 0; i < headerChunk.trackCount; i++) {
			const auto trackChunk = [&is]() {
				Inner::TrackChunk c = Inner::read<decltype(c)>(is);
				if (c.MTrk != Inner::TrackChunk().MTrk) {
					throw std::runtime_error("MTrk chunk error.");
				}
				Inner::changeEndian(c.dataLength);
				return c;
			}();

			Smf::Track track;
			try{
				std::uint64_t currentPosition = 0;		// 現在位置
				uint8_t beforeStatus = 0;
				for (const auto beginPosition = is.tellg(); is.tellg() - beginPosition < trackChunk.dataLength; ) {
					auto readVariableValue = [&is] {					// 可変長数値を取得
						return inner::readVariableValue([&] {return Inner::read<uint8_t>(is); });
					};

					currentPosition += readVariableValue();		// 現在位置 += デルタタイム

					// status 読み込み
					const auto status = [&] {
						const uint8_t status = Inner::read<decltype(status)>(is);
						if (!(status & 0x80)) {					// status 省略なら直前値を採用
							is.seekg(-1, std::ios::cur);		// 位置を戻す
							return beforeStatus;
						}
						beforeStatus = status;
						return status;
					}();

					switch (status & 0xf0) {
					case EventNoteOff::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventNoteOff>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventNoteOn::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventNoteOn>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventPolyphonicKeyPressure::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventPolyphonicKeyPressure>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventControlChange::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventControlChange>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventProgramChange::statusByte: {
						const uint8_t n = Inner::read<decltype(n)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventProgramChange>(status & 0xf, n & 0x7f));
						break;
					}
					case EventPitchBend::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						const auto n = ((a[0] & 0x7f) + (a[1] & 0x7f) * 0x80) - 8192;
						track.events.emplace(currentPosition, std::make_shared<EventPitchBend>(status & 0xf, n));
						break;
					}
					case EventChannelPressure::statusByte: {
						const uint8_t n = Inner::read<decltype(n)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventChannelPressure>(status & 0xf, n & 0x7f));
						break;
					}
					default:
						switch (status) {
						case EventExclusive::statusByte: {
							const auto size = readVariableValue();		// データ長
							std::vector<uint8_t> data;
							for (auto i = 0; i < size; i++) {
								const uint8_t n = Inner::read<decltype(n)>(is);
								if (n == 0xf7) {				// EOX(終了コード)
									if (i != size - 1) {
										// ヘンなところで終わった(が、エラーにはせず続行)
										std::clog << "[warning] exclusive size error. EOX(0xf7) is failed position." << std::endl;	// throw std::runtime_error("exclusive size error");
										break;
									}
									break;
								}
								if ((n & 0x80) != 0) {
									// あるべきハズのEOX(0xf7)が無い(が、エラーにはせず続行)
									std::clog << "[warning] exclusive data error. EOX(0xf7) is missing." << std::endl;
									break;
								}
								data.push_back(n);
							}
							track.events.emplace(currentPosition, std::make_shared<EventExclusive>(std::move(data)));
							break;
						}
						case EventMeta::statusByte: {
							const uint8_t type = Inner::read<decltype(type)>(is);					// イベントタイプ
							const auto len = readVariableValue();									// データ長
							std::vector<uint8_t> data(len);
							if (const auto readed = is.read(reinterpret_cast<char*>(data.data()), data.size()).gcount(); readed < static_cast<std::intmax_t>(data.size())) {
								data.resize(readed);
								// データが足りない(が、エラーにはせず続行)
								std::clog << "[warning] meta data size error." << std::endl;
							}
							track.events.emplace(currentPosition, std::make_shared<EventMeta>(static_cast<EventMeta::Type>(type), std::move(data)));
							break;
						}
						default:
							assert(false);
							break;
						}
					}
				}
			} catch (...) {
				if (track.events.size() > 0) {
					smf.tracks.emplace_back(std::move(track));
				}
				throw;
			}
			smf.tracks.emplace_back(std::move(track));
		}
	} catch (...) {
		ep = std::current_exception();
	}
	if (ep) {
		try {
			std::rethrow_exception(ep);
		} catch (const std::exception& e) {
			std::clog << "[warning] exception: " << e.what() << std::endl;
		} catch (...) {
			std::clog << "[warning] exception unknwon" << std::endl;
		}
		if (smf.tracks.size() <= 0) {	// トラックがまったくパースできてない状態なら
			std::rethrow_exception(ep);	// throw で終了
		}
	}
	return smf;
}